

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::ComputeObjectMaxPath(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  cmValue cVar2;
  ostream *poVar3;
  uint pmax;
  ostringstream w;
  uint local_1b4;
  string local_1b0;
  string local_190 [11];
  
  this->ObjectPathMax = 1000;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"CMAKE_OBJECT_PATH_MAX",(allocator<char> *)&local_1b0);
  cVar2 = cmMakefile::GetDefinition(this_00,local_190);
  std::__cxx11::string::~string((string *)local_190);
  if ((cVar2.Value != (string *)0x0) && ((cVar2.Value)->_M_string_length != 0)) {
    iVar1 = __isoc99_sscanf(((cVar2.Value)->_M_dataplus)._M_p,"%u",&local_1b4);
    if (iVar1 == 1) {
      if (0x7f < (ulong)local_1b4) {
        this->ObjectPathMax = (ulong)local_1b4;
        goto LAB_00325cd0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar3 = std::operator<<((ostream *)local_190,"CMAKE_OBJECT_PATH_MAX is set to ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", which is less than the minimum of 128.  ");
      std::operator<<(poVar3,"The value will be ignored.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar3 = std::operator<<((ostream *)local_190,"CMAKE_OBJECT_PATH_MAX is set to \"");
      poVar3 = std::operator<<(poVar3,(string *)cVar2.Value);
      poVar3 = std::operator<<(poVar3,"\", which fails to parse as a positive integer.  ");
      std::operator<<(poVar3,"The value will be ignored.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
    }
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
LAB_00325cd0:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->ObjectMaxPathViolations)._M_t);
  return;
}

Assistant:

void cmLocalGenerator::ComputeObjectMaxPath()
{
// Choose a maximum object file name length.
#if defined(_WIN32) || defined(__CYGWIN__)
  this->ObjectPathMax = 250;
#else
  this->ObjectPathMax = 1000;
#endif
  cmValue plen = this->Makefile->GetDefinition("CMAKE_OBJECT_PATH_MAX");
  if (cmNonempty(plen)) {
    unsigned int pmax;
    if (sscanf(plen->c_str(), "%u", &pmax) == 1) {
      if (pmax >= 128) {
        this->ObjectPathMax = pmax;
      } else {
        std::ostringstream w;
        w << "CMAKE_OBJECT_PATH_MAX is set to " << pmax
          << ", which is less than the minimum of 128.  "
          << "The value will be ignored.";
        this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
      }
    } else {
      std::ostringstream w;
      w << "CMAKE_OBJECT_PATH_MAX is set to \"" << *plen
        << "\", which fails to parse as a positive integer.  "
        << "The value will be ignored.";
      this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }
  this->ObjectMaxPathViolations.clear();
}